

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  clock_t cVar4;
  clock_t cVar5;
  clock_t cVar6;
  float *pfVar7;
  float *pfVar8;
  Mat *pMVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Intel_V4L2 *local_b10;
  Mat translation;
  float *local_af0;
  Mat pose;
  string filepath;
  vector<Matrix,_std::allocator<Matrix>_> local_a18;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsLeft_t0;
  Vec3f rotation_euler;
  float local_9dc;
  float local_9d8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsLeft_t1;
  string filename_pose;
  Mat local_938 [96];
  Mat local_8d8 [144];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsRight_t0;
  _OutputArray local_828;
  undefined1 *local_810 [2];
  undefined1 local_800 [16];
  Range local_7f0;
  Mat rotation;
  size_t local_7e0;
  float *local_7d8;
  float *local_7c8;
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsRight_t1;
  string strSettingPath;
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  FeatureSet currentVOFeatures;
  Mat projMatrr;
  pointer pMStack_690;
  pointer local_688;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> oldPointsLeft_t0;
  FileStorage fSettings;
  _InputArray local_5d8 [4];
  Mat imageRight_t0_color;
  Mat projMatrl;
  Mat xyz;
  Mat points3D_t0;
  Mat imageLeft_t1;
  Mat imageLeft_t0;
  Mat imageRight_t0;
  Mat frame_pose;
  Mat trajectory;
  Mat frame_pose32;
  Mat Rpose;
  Mat points4D_t0;
  Mat points3D;
  Mat points4D;
  
  local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (argc == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Display ground truth trajectory",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    std::__cxx11::string::string((string *)&filename_pose,argv[3],(allocator *)&projMatrl);
    local_6e8[0] = local_6d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e8,filename_pose._M_dataplus._M_p,
               filename_pose._M_dataplus._M_p + filename_pose._M_string_length);
    loadPoses(&projMatrr,local_6e8);
    _projMatrl = local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_688;
    local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data.
    _M_start = _projMatrr;
    local_a18.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data.
    _M_finish = pMStack_690;
    _projMatrr = (pointer)0x0;
    std::vector<Matrix,_std::allocator<Matrix>_>::~vector
              ((vector<Matrix,_std::allocator<Matrix>_> *)&projMatrl);
    std::vector<Matrix,_std::allocator<Matrix>_>::~vector
              ((vector<Matrix,_std::allocator<Matrix>_> *)&projMatrr);
    if (local_6e8[0] != local_6d8) {
      operator_delete(local_6e8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename_pose._M_dataplus._M_p != &filename_pose.field_2) {
      operator_delete(filename_pose._M_dataplus._M_p);
    }
  }
  else if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Usage: ./run path_to_sequence(rgbd for using intel rgbd) path_to_calibration [optional]path_to_ground_truth_pose"
               ,0x70);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    iVar1 = 1;
    std::ostream::flush();
    goto LAB_00104f91;
  }
  std::__cxx11::string::string((string *)&filepath,argv[1],(allocator *)&filename_pose);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Filepath: ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,filepath._M_dataplus._M_p,filepath._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar1 = std::__cxx11::string::compare((char *)&filepath);
  std::__cxx11::string::string((string *)&strSettingPath,argv[2],(allocator *)&filename_pose);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calibration Filepath: ",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,strSettingPath._M_dataplus._M_p,
                      strSettingPath._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  filename_pose._M_string_length = 0;
  filename_pose.field_2._M_allocated_capacity =
       filename_pose.field_2._M_allocated_capacity & 0xffffffffffffff00;
  filename_pose._M_dataplus._M_p = (pointer)&filename_pose.field_2;
  cv::FileStorage::FileStorage(&fSettings,(string *)&strSettingPath,0,(string *)&filename_pose);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename_pose._M_dataplus._M_p != &filename_pose.field_2) {
    operator_delete(filename_pose._M_dataplus._M_p);
  }
  cv::FileStorage::operator[]((char *)&filename_pose);
  fVar11 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  fVar12 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  fVar13 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  fVar14 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::FileStorage::operator[]((char *)&filename_pose);
  fVar15 = cv::FileNode::operator_cast_to_float((FileNode *)&filename_pose);
  cv::Mat::Mat(&projMatrr,3,4,5);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)&rotation,&projMatrr);
  *local_7d8 = fVar11;
  if (_rotation == (Mat *)0x0) {
    _rotation = (Mat *)0x0;
    pfVar7 = local_7d8;
  }
  else {
    pfVar7 = (float *)((long)local_7d8 + local_7e0);
    if (local_7c8 <= (float *)((long)local_7d8 + local_7e0)) {
      cv::MatConstIterator::seek((long)&rotation,true);
      pfVar7 = local_7d8;
    }
  }
  *pfVar7 = 0.0;
  _translation = _rotation;
  if (_rotation == (Mat *)0x0) {
    *pfVar7 = fVar13;
LAB_00103a4f:
    *pfVar7 = 0.0;
    local_af0 = pfVar7;
LAB_00103a55:
    *local_af0 = fVar12;
LAB_00103a5f:
    *local_af0 = 0.0;
LAB_00103a65:
    *local_af0 = 0.0;
LAB_00103a6b:
    *local_af0 = 0.0;
LAB_00103c51:
    pMVar9 = (Mat *)0x0;
  }
  else {
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar13;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = fVar13;
      if (_translation == (Mat *)0x0) goto LAB_00103a4f;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 0.0;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103a55;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (local_7c8 <= pfVar8) {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 0.0;
      if (_translation != (Mat *)0x0) goto LAB_00103aeb;
      *pfVar7 = fVar14;
      local_af0 = pfVar7;
LAB_00103c3f:
      *local_af0 = 0.0;
LAB_00103c45:
      *local_af0 = 1.0;
LAB_00103c4b:
      *local_af0 = 0.0;
      goto LAB_00103c51;
    }
    *pfVar8 = 0.0;
    pfVar7 = pfVar8;
LAB_00103aeb:
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar12;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = fVar12;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103a5f;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar14;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = fVar14;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103c3f;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 0.0;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103a65;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 0.0;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103c45;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 0.0;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103a6b;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 1.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 1.0;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103c4b;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&translation,true);
      *pfVar7 = 0.0;
      local_af0 = pfVar7;
      if (_translation == (Mat *)0x0) goto LAB_00103c51;
    }
    pMVar9 = _translation;
    local_af0 = (float *)(local_7e0 + (long)pfVar7);
    if (local_7c8 <= (float *)(local_7e0 + (long)pfVar7)) {
      cv::MatConstIterator::seek((long)&translation,true);
      pMVar9 = _translation;
      local_af0 = pfVar7;
    }
  }
  cv::Mat::Mat((Mat *)&filename_pose);
  filename_pose._M_dataplus._M_p =
       (pointer)((ulong)filename_pose._M_dataplus._M_p & 0xfffffffffffff000 | 5);
  cv::Mat_<float>::operator=((Mat_<float> *)&filename_pose,pMVar9);
  cv::Mat::Mat(&projMatrl,(Mat *)&filename_pose);
  cv::Mat::~Mat((Mat *)&filename_pose);
  cv::Mat::~Mat(&projMatrr);
  cv::Mat::Mat(&rotation,3,4,5);
  cv::MatConstIterator::MatConstIterator((MatConstIterator *)&translation,&rotation);
  *local_af0 = fVar11;
  if (_translation == (Mat *)0x0) {
    _pose = (Mat *)0x0;
    pfVar7 = local_af0;
  }
  else {
    pfVar7 = (float *)((long)local_af0 + local_7e0);
    _pose = _translation;
    if (local_7c8 <= (float *)((long)local_af0 + local_7e0)) {
      cv::MatConstIterator::seek((long)&translation,true);
      pfVar7 = local_af0;
      _pose = _translation;
    }
  }
  *pfVar7 = 0.0;
  if (_pose == (Mat *)0x0) {
    *pfVar7 = fVar13;
LAB_00103de0:
    *pfVar7 = fVar15;
LAB_00103dea:
    *pfVar7 = fVar12;
LAB_00103df4:
    *pfVar7 = 0.0;
LAB_00103dfa:
    *pfVar7 = 0.0;
LAB_00103e00:
    *pfVar7 = 0.0;
LAB_00104044:
    pMVar9 = (Mat *)0x0;
  }
  else {
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar13;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = fVar13;
      if (_pose == (Mat *)0x0) goto LAB_00103de0;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar15;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = fVar15;
      if (_pose == (Mat *)0x0) goto LAB_00103dea;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (local_7c8 <= pfVar8) {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = 0.0;
      if (_pose != (Mat *)0x0) goto LAB_00103e9c;
      *pfVar7 = fVar14;
LAB_00104032:
      *pfVar7 = 0.0;
LAB_00104038:
      *pfVar7 = 1.0;
LAB_0010403e:
      *pfVar7 = 0.0;
      goto LAB_00104044;
    }
    *pfVar8 = 0.0;
    pfVar7 = pfVar8;
LAB_00103e9c:
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar12;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = fVar12;
      if (_pose == (Mat *)0x0) goto LAB_00103df4;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = fVar14;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = fVar14;
      if (_pose == (Mat *)0x0) goto LAB_00104032;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = 0.0;
      if (_pose == (Mat *)0x0) goto LAB_00103dfa;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = 0.0;
      if (_pose == (Mat *)0x0) goto LAB_00104038;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = 0.0;
      if (_pose == (Mat *)0x0) goto LAB_00103e00;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 1.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = 1.0;
      if (_pose == (Mat *)0x0) goto LAB_0010403e;
    }
    pfVar8 = (float *)(local_7e0 + (long)pfVar7);
    if (pfVar8 < local_7c8) {
      *pfVar8 = 0.0;
      pfVar7 = pfVar8;
    }
    else {
      cv::MatConstIterator::seek((long)&pose,true);
      *pfVar7 = 0.0;
      if (_pose == (Mat *)0x0) goto LAB_00104044;
    }
    pMVar9 = _pose;
    if (local_7c8 <= (float *)(local_7e0 + (long)pfVar7)) {
      cv::MatConstIterator::seek((long)&pose,true);
      pMVar9 = _pose;
    }
  }
  cv::Mat::Mat((Mat *)&filename_pose);
  filename_pose._M_dataplus._M_p =
       (pointer)((ulong)filename_pose._M_dataplus._M_p & 0xfffffffffffff000 | 5);
  cv::Mat_<float>::operator=((Mat_<float> *)&filename_pose,pMVar9);
  cv::Mat::Mat(&projMatrr,(Mat *)&filename_pose);
  cv::Mat::~Mat((Mat *)&filename_pose);
  cv::Mat::~Mat(&rotation);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_left: ",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  poVar2 = (ostream *)std::ostream::flush();
  cv::operator<<(poVar2,&projMatrl);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_right: ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  poVar2 = (ostream *)std::ostream::flush();
  cv::operator<<(poVar2,&projMatrr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cv::Mat::eye((int)&filename_pose,3,3);
  cv::Mat::Mat(&rotation);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&rotation,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  cv::Mat::zeros((int)&filename_pose,3,1);
  cv::Mat::Mat(&translation);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&translation,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  cv::Mat::zeros((int)&filename_pose,3,1);
  cv::Mat::Mat(&pose);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&pose,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  cv::Mat::eye((int)&filename_pose,3,3);
  cv::Mat::Mat(&Rpose);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&Rpose,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  cv::Mat::eye((int)&filename_pose,4,4);
  cv::Mat::Mat(&frame_pose);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&frame_pose,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  cv::Mat::eye((int)&filename_pose,4,4);
  cv::Mat::Mat(&frame_pose32);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&frame_pose32,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"frame_pose ",0xb);
  cv::operator<<((ostream *)&std::cout,&frame_pose);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  cv::Mat::zeros((int)&filename_pose,600,0x4b0);
  cv::Mat::Mat(&trajectory);
  (**(code **)(*(long *)filename_pose._M_dataplus._M_p + 0x18))
            (filename_pose._M_dataplus._M_p,&filename_pose,&trajectory,0xffffffff);
  cv::Mat::~Mat(local_8d8);
  cv::Mat::~Mat(local_938);
  cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
  currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentVOFeatures.points.
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currentVOFeatures.points.
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currentVOFeatures.points.
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::Mat(&points4D);
  cv::Mat::Mat(&points3D);
  cv::Mat::Mat(&imageRight_t0);
  cv::Mat::Mat(&imageLeft_t0);
  if (iVar1 == 0) {
    local_b10 = (Intel_V4L2 *)operator_new(0x38);
    Intel_V4L2::Intel_V4L2(local_b10);
    iVar10 = -0xb;
    do {
      (**(code **)(*(long *)local_b10 + 0x18))(local_b10,&imageLeft_t0,&imageRight_t0);
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
  }
  else {
    cv::Mat::Mat((Mat *)&filename_pose);
    local_708[0] = local_6f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_708,filepath._M_dataplus._M_p,
               filepath._M_dataplus._M_p + filepath._M_string_length);
    loadImageLeft(&filename_pose,&imageLeft_t0,0,local_708);
    if (local_708[0] != local_6f8) {
      operator_delete(local_708[0]);
    }
    cv::Mat::Mat(&imageRight_t0_color);
    local_728[0] = local_718;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_728,filepath._M_dataplus._M_p,
               filepath._M_dataplus._M_p + filepath._M_string_length);
    loadImageRight(&imageRight_t0_color,&imageRight_t0,0,local_728);
    if (local_728[0] != local_718) {
      operator_delete(local_728[0]);
    }
    cv::Mat::~Mat(&imageRight_t0_color);
    cv::Mat::~Mat((Mat *)&filename_pose);
    local_b10 = (Intel_V4L2 *)0x0;
  }
  iVar10 = 1;
  do {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"frame id ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,iVar10);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    cv::Mat::Mat(&imageRight_t0_color);
    cv::Mat::Mat(&imageLeft_t1);
    if (iVar1 == 0) {
      (**(code **)(*(long *)local_b10 + 0x18))(local_b10,&imageLeft_t1,&imageRight_t0_color);
    }
    else {
      cv::Mat::Mat((Mat *)&filename_pose);
      local_810[0] = local_800;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_810,filepath._M_dataplus._M_p,
                 filepath._M_dataplus._M_p + filepath._M_string_length);
      loadImageLeft(&filename_pose,&imageLeft_t1,iVar10,(string *)local_810);
      if (local_810[0] != local_800) {
        operator_delete(local_810[0]);
      }
      cv::Mat::Mat(&points3D_t0);
      local_788[0] = local_778;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_788,filepath._M_dataplus._M_p,
                 filepath._M_dataplus._M_p + filepath._M_string_length);
      loadImageRight(&points3D_t0,&imageRight_t0_color,iVar10,(string *)local_788);
      if (local_788[0] != local_778) {
        operator_delete(local_788[0]);
      }
      cv::Mat::~Mat(&points3D_t0);
      cv::Mat::~Mat((Mat *)&filename_pose);
    }
    cVar4 = clock();
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              (&oldPointsLeft_t0,&currentVOFeatures.points);
    pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    matchingFeatures(&imageLeft_t0,&imageRight_t0,&imageLeft_t1,&imageRight_t0_color,
                     &currentVOFeatures,(vector *)&pointsLeft_t0,(vector *)&pointsRight_t0,
                     (vector *)&pointsLeft_t1,(vector *)&pointsRight_t1);
    cv::Mat::operator=(&imageLeft_t0,&imageLeft_t1);
    cv::Mat::operator=(&imageRight_t0,&imageRight_t0_color);
    cv::Mat::Mat(&points3D_t0);
    cv::Mat::Mat(&points4D_t0);
    filename_pose.field_2._M_allocated_capacity = 0;
    filename_pose._M_dataplus._M_p._0_4_ = 0x1010000;
    filename_pose._M_string_length = (size_type)&projMatrl;
    _xyz = 0x1010000;
    local_5d8[0].sz.width = 0;
    local_5d8[0].sz.height = 0;
    local_5d8[0].flags = -0x7efcfff3;
    local_5d8[0].obj = &pointsLeft_t0;
    _rotation_euler = -2.4060936e-38;
    local_828.super__InputArray.sz.width = 0;
    local_828.super__InputArray.sz.height = 0;
    local_828.super__InputArray.flags = 0x2010000;
    local_828.super__InputArray.obj = &points4D_t0;
    cv::triangulatePoints
              ((_InputArray *)&filename_pose,(_InputArray *)&xyz,local_5d8,
               (_InputArray *)&rotation_euler,&local_828);
    cv::Mat::t();
    cv::_InputArray::_InputArray((_InputArray *)&xyz,(MatExpr *)&filename_pose);
    local_5d8[0].sz.width = 0;
    local_5d8[0].sz.height = 0;
    local_5d8[0].flags = 0x2010000;
    local_5d8[0].obj = &points3D_t0;
    cv::convertPointsFromHomogeneous((_InputArray *)&xyz,(_OutputArray *)local_5d8);
    cv::Mat::~Mat(local_8d8);
    cv::Mat::~Mat(local_938);
    cv::Mat::~Mat((Mat *)filename_pose.field_2._M_local_buf);
    cVar5 = clock();
    trackingFrame2Frame(&projMatrl,&projMatrr,(vector *)&pointsLeft_t0,(vector *)&pointsLeft_t1,
                        &points3D_t0,&rotation,&translation,false);
    cVar6 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"tracking frame 2 frame: ",0x18);
    poVar2 = std::ostream::_M_insert<double>((double)(((float)(cVar6 - cVar5) / 1e+06) * 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    displayTracking(&imageLeft_t1,(vector *)&pointsLeft_t0,(vector *)&pointsLeft_t1);
    rotationMatrixToEulerAngles((Mat *)&rotation_euler);
    cv::Mat::Mat((Mat *)&filename_pose);
    if (((0.1 <= ABS(local_9dc)) || (0.1 <= ABS(_rotation_euler))) ||
       (local_9d8 = SUB84(&pointsRight_t0,0), 0.1 <= ABS(local_9d8))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Too large rotation",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      integrateOdometryStereo(iVar10,(Mat *)&filename_pose,&frame_pose,&rotation,&translation);
    }
    cVar5 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Info] frame times (ms): ",0x19);
    fVar11 = (float)(((double)(cVar5 - cVar4) * 1000.0) / 1000000.0);
    poVar2 = std::ostream::_M_insert<double>((double)fVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Info] FPS: ",0xc);
    fVar11 = 1000.0 / fVar11;
    poVar2 = std::ostream::_M_insert<double>((double)fVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_828.super__InputArray.flags = -0x80000000;
    local_828.super__InputArray._4_4_ = 0x7fffffff;
    local_7f0.start = 3;
    local_7f0.end = 4;
    cv::Mat::Mat((Mat *)local_5d8,&frame_pose,(Range *)&local_828,&local_7f0);
    cv::Mat::clone();
    cv::Mat::~Mat((Mat *)local_5d8);
    display(iVar10,&trajectory,&xyz,(vector *)&local_a18,fVar11,argc == 4);
    cv::Mat::~Mat(&xyz);
    cv::Mat::~Mat((Mat *)&filename_pose);
    cv::Mat::~Mat(&points4D_t0);
    cv::Mat::~Mat(&points3D_t0);
    if (pointsRight_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pointsRight_t1.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (pointsLeft_t1.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pointsLeft_t1.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (pointsRight_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pointsRight_t0.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (pointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pointsLeft_t0.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (oldPointsLeft_t0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(oldPointsLeft_t0.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(&imageLeft_t1);
    cv::Mat::~Mat(&imageRight_t0_color);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 9000);
  cv::Mat::~Mat(&imageLeft_t0);
  cv::Mat::~Mat(&imageRight_t0);
  cv::Mat::~Mat(&points3D);
  cv::Mat::~Mat(&points4D);
  if (currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (currentVOFeatures.points.
      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(currentVOFeatures.points.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(&trajectory);
  cv::Mat::~Mat(&frame_pose32);
  cv::Mat::~Mat(&frame_pose);
  cv::Mat::~Mat(&Rpose);
  cv::Mat::~Mat(&pose);
  cv::Mat::~Mat(&translation);
  cv::Mat::~Mat(&rotation);
  cv::Mat::~Mat(&projMatrr);
  cv::Mat::~Mat(&projMatrl);
  cv::FileStorage::~FileStorage(&fSettings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strSettingPath._M_dataplus._M_p != &strSettingPath.field_2) {
    operator_delete(strSettingPath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filepath._M_dataplus._M_p != &filepath.field_2) {
    operator_delete(filepath._M_dataplus._M_p);
  }
  iVar1 = 0;
LAB_00104f91:
  std::vector<Matrix,_std::allocator<Matrix>_>::~vector(&local_a18);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{

    // -----------------------------------------
    // Load images and calibration parameters
    // -----------------------------------------
    bool display_ground_truth = false;
    bool use_intel_rgbd = false;
    std::vector<Matrix> pose_matrix_gt;
    if(argc == 4)
    {   display_ground_truth = true;
        cerr << "Display ground truth trajectory" << endl;
        // load ground truth pose
        string filename_pose = string(argv[3]);
        pose_matrix_gt = loadPoses(filename_pose);

    }
    if(argc < 3)
    {
        cerr << "Usage: ./run path_to_sequence(rgbd for using intel rgbd) path_to_calibration [optional]path_to_ground_truth_pose" << endl;
        return 1;
    }

    // Sequence
    string filepath = string(argv[1]);
    cout << "Filepath: " << filepath << endl;

    if(filepath == "rgbd") use_intel_rgbd = true;

    // Camera calibration
    string strSettingPath = string(argv[2]);
    cout << "Calibration Filepath: " << strSettingPath << endl;

    cv::FileStorage fSettings(strSettingPath, cv::FileStorage::READ);

    
    float fx = fSettings["Camera.fx"];
    float fy = fSettings["Camera.fy"];
    float cx = fSettings["Camera.cx"];
    float cy = fSettings["Camera.cy"];
    float bf = fSettings["Camera.bf"];

    cv::Mat projMatrl = (cv::Mat_<float>(3, 4) << fx, 0., cx, 0., 0., fy, cy, 0., 0,  0., 1., 0.);
    cv::Mat projMatrr = (cv::Mat_<float>(3, 4) << fx, 0., cx, bf, 0., fy, cy, 0., 0,  0., 1., 0.);
    cout << "P_left: " << endl << projMatrl << endl;
    cout << "P_right: " << endl << projMatrr << endl;

    // -----------------------------------------
    // Initialize variables
    // -----------------------------------------
    cv::Mat rotation = cv::Mat::eye(3, 3, CV_64F);
    cv::Mat translation = cv::Mat::zeros(3, 1, CV_64F);

    cv::Mat pose = cv::Mat::zeros(3, 1, CV_64F);
    cv::Mat Rpose = cv::Mat::eye(3, 3, CV_64F);
    
    cv::Mat frame_pose = cv::Mat::eye(4, 4, CV_64F);
    cv::Mat frame_pose32 = cv::Mat::eye(4, 4, CV_32F);

    std::cout << "frame_pose " << frame_pose << std::endl;
    cv::Mat trajectory = cv::Mat::zeros(600, 1200, CV_8UC3);
    FeatureSet currentVOFeatures;
    cv::Mat points4D, points3D;
    int init_frame_id = 0;

    // ------------------------
    // Load first images
    // ------------------------
    cv::Mat imageRight_t0,  imageLeft_t0;
    CameraBase *pCamera = NULL;
    if(use_intel_rgbd)
    {   
        pCamera = new Intel_V4L2;
        for (int throw_frames = 10 ; throw_frames >=0 ; throw_frames--)
            pCamera->getLRFrames(imageLeft_t0,imageRight_t0);
    }
    else
    {
        cv::Mat imageLeft_t0_color;
        loadImageLeft(imageLeft_t0_color,  imageLeft_t0, init_frame_id, filepath);
        
        cv::Mat imageRight_t0_color;  
        loadImageRight(imageRight_t0_color, imageRight_t0, init_frame_id, filepath);
    }
    clock_t t_a, t_b;

    // -----------------------------------------
    // Run visual odometry
    // -----------------------------------------
    std::vector<FeaturePoint> oldFeaturePointsLeft;
    std::vector<FeaturePoint> currentFeaturePointsLeft;

    for (int frame_id = init_frame_id+1; frame_id < 9000; frame_id++)
    {

        std::cout << std::endl << "frame id " << frame_id << std::endl;
        // ------------
        // Load images
        // ------------
        cv::Mat imageRight_t1,  imageLeft_t1;
        if(use_intel_rgbd)
        {
            pCamera->getLRFrames(imageLeft_t1,imageRight_t1);
        }
        else
        {
            cv::Mat imageLeft_t1_color;
            loadImageLeft(imageLeft_t1_color,  imageLeft_t1, frame_id, filepath);        
            cv::Mat imageRight_t1_color;  
            loadImageRight(imageRight_t1_color, imageRight_t1, frame_id, filepath);            
        }


        t_a = clock();
        std::vector<cv::Point2f> oldPointsLeft_t0 = currentVOFeatures.points;


        std::vector<cv::Point2f> pointsLeft_t0, pointsRight_t0, pointsLeft_t1, pointsRight_t1;  
        matchingFeatures( imageLeft_t0, imageRight_t0,
                          imageLeft_t1, imageRight_t1, 
                          currentVOFeatures,
                          pointsLeft_t0, 
                          pointsRight_t0, 
                          pointsLeft_t1, 
                          pointsRight_t1);  

        imageLeft_t0 = imageLeft_t1;
        imageRight_t0 = imageRight_t1;

        std::vector<cv::Point2f>& currentPointsLeft_t0 = pointsLeft_t0;
        std::vector<cv::Point2f>& currentPointsLeft_t1 = pointsLeft_t1;
        
        std::vector<cv::Point2f> newPoints;
        std::vector<bool> valid; // valid new points are ture

        // ---------------------
        // Triangulate 3D Points
        // ---------------------
        cv::Mat points3D_t0, points4D_t0;
        cv::triangulatePoints( projMatrl,  projMatrr,  pointsLeft_t0,  pointsRight_t0,  points4D_t0);
        cv::convertPointsFromHomogeneous(points4D_t0.t(), points3D_t0);

/*        cv::Mat points3D_t1, points4D_t1;
        cv::triangulatePoints( projMatrl,  projMatrr,  pointsLeft_t1,  pointsRight_t1,  points4D_t1);
        cv::convertPointsFromHomogeneous(points4D_t1.t(), points3D_t1);*/

        // ---------------------
        // Tracking transfomation
        // ---------------------
	clock_t tic_gpu = clock();
        trackingFrame2Frame(projMatrl, projMatrr, pointsLeft_t0, pointsLeft_t1, points3D_t0, rotation, translation, false);
	clock_t toc_gpu = clock();
	std::cerr << "tracking frame 2 frame: " << float(toc_gpu - tic_gpu)/CLOCKS_PER_SEC*1000 << "ms" << std::endl;
        displayTracking(imageLeft_t1, pointsLeft_t0, pointsLeft_t1);


/*        points4D = points4D_t0;
        frame_pose.convertTo(frame_pose32, CV_32F);
        points4D = frame_pose32 * points4D;
        cv::convertPointsFromHomogeneous(points4D.t(), points3D);*/

        // ------------------------------------------------
        // Intergrating and display
        // ------------------------------------------------

        cv::Vec3f rotation_euler = rotationMatrixToEulerAngles(rotation);


        cv::Mat rigid_body_transformation;

        if(abs(rotation_euler[1])<0.1 && abs(rotation_euler[0])<0.1 && abs(rotation_euler[2])<0.1)
        {
            integrateOdometryStereo(frame_id, rigid_body_transformation, frame_pose, rotation, translation);

        } else {

            std::cout << "Too large rotation"  << std::endl;
        }
        t_b = clock();
        float frame_time = 1000*(double)(t_b-t_a)/CLOCKS_PER_SEC;
        float fps = 1000/frame_time;
        cout << "[Info] frame times (ms): " << frame_time << endl;
        cout << "[Info] FPS: " << fps << endl;

        // std::cout << "rigid_body_transformation" << rigid_body_transformation << std::endl;
        // std::cout << "rotation: " << rotation_euler << std::endl;
        // std::cout << "translation: " << translation.t() << std::endl;
        // std::cout << "frame_pose" << frame_pose << std::endl;


        cv::Mat xyz = frame_pose.col(3).clone();
        display(frame_id, trajectory, xyz, pose_matrix_gt, fps, display_ground_truth);

    }

    return 0;
}